

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::translate
                   (char_t *buffer,char_t *from,char_t *to,size_t to_length)

{
  ulong in_RCX;
  char *pcVar1;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  char_t *pos;
  char_t ch;
  char_t *write;
  char_t *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  char cVar2;
  char *local_28;
  char *local_8;
  
  local_28 = in_RDI;
  local_8 = in_RDI;
  while (*local_8 != '\0') {
    pcVar1 = local_8 + 1;
    cVar2 = *local_8;
    in_stack_ffffffffffffffc8 =
         find_char((char_t *)CONCAT17(cVar2,in_stack_ffffffffffffffd0),
                   (char_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38));
    local_8 = pcVar1;
    if (in_stack_ffffffffffffffc8 == (char_t *)0x0) {
      *local_28 = cVar2;
      local_28 = local_28 + 1;
    }
    else if ((ulong)((long)in_stack_ffffffffffffffc8 - in_RSI) < in_RCX) {
      *local_28 = in_stack_ffffffffffffffc8[in_RDX - in_RSI];
      local_28 = local_28 + 1;
    }
  }
  *local_28 = '\0';
  return local_28;
}

Assistant:

PUGI_IMPL_FN char_t* translate(char_t* buffer, const char_t* from, const char_t* to, size_t to_length)
	{
		char_t* write = buffer;

		while (*buffer)
		{
			PUGI_IMPL_DMC_VOLATILE char_t ch = *buffer++;

			const char_t* pos = find_char(from, ch);

			if (!pos)
				*write++ = ch; // do not process
			else if (static_cast<size_t>(pos - from) < to_length)
				*write++ = to[pos - from]; // replace
		}

		// zero-terminate
		*write = 0;

		return write;
	}